

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readFunctions(WasmBinaryReader *this)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  uint32_t uVar4;
  size_type sVar5;
  pointer pFVar6;
  type func_00;
  Expression *pEVar7;
  string *psVar8;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  string *local_150;
  Err *err_1;
  Result<wasm::Ok> inst;
  Err *err;
  Result<wasm::Ok> start;
  bool isStart;
  size_type currFunctionIndex;
  undefined8 local_ac;
  undefined8 local_a4;
  int local_9c;
  int iStack_98;
  BinaryLocation local_94;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *local_90;
  value_type *func;
  Index endOfFunction;
  ulong local_60;
  size_t size;
  size_t sizePos;
  size_t i;
  allocator<char> local_31;
  string local_30;
  WasmBinaryReader *local_10;
  WasmBinaryReader *this_local;
  
  local_10 = this;
  uVar4 = getU32LEB(this);
  this->numFuncBodies = uVar4;
  IVar1 = this->numFuncBodies;
  IVar2 = this->numFuncImports;
  sVar5 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::size(&this->wasm->functions);
  if (IVar1 + IVar2 != sVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"invalid function section size, must equal types",&local_31);
    throwError(this,&local_30);
  }
  if ((this->DWARF & 1U) != 0) {
    IRBuilder::setBinaryLocation(&this->builder,&this->pos,this->codeSectionLocation);
  }
  sizePos = 0;
  do {
    if (this->numFuncBodies <= sizePos) {
      return;
    }
    size = this->pos;
    uVar4 = getU32LEB(this);
    local_60 = (ulong)uVar4;
    if (local_60 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&endOfFunction,"empty function size",(allocator<char> *)((long)&func + 7)
                );
      throwError(this,(string *)&endOfFunction);
    }
    func._0_4_ = (int)this->pos + uVar4;
    local_90 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::operator[](&this->wasm->functions,this->numFuncImports + sizePos);
    pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_90);
    this->currFunction = pFVar6;
    if ((this->DWARF & 1U) != 0) {
      local_9c = (int)size - (int)this->codeSectionLocation;
      iStack_98 = (int)this->pos - (int)this->codeSectionLocation;
      local_94 = ((int)this->pos - (int)this->codeSectionLocation) + (int)local_60;
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_90);
      (pFVar6->funcLocation).start = local_9c;
      (pFVar6->funcLocation).declarations = iStack_98;
      (pFVar6->funcLocation).end = local_94;
    }
    SourceMapReader::readDebugLocationAt
              ((optional<wasm::Function::DebugLocation> *)((long)&currFunctionIndex + 4),
               &this->sourceMapReader,this->pos);
    pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_90);
    *(undefined8 *)
     &(pFVar6->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
         stack0xffffffffffffff4c;
    *(undefined8 *)
     ((long)&(pFVar6->prologLocation).
             super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) = local_ac;
    *(undefined8 *)
     ((long)&(pFVar6->prologLocation).
             super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
             symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4) = local_a4;
    readVars(this);
    func_00 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator*
                        (local_90);
    setLocalNames(this,func_00,this->numFuncImports + (int)sizePos);
    sVar5 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::size(&this->wasm->functions);
    if (((this->skipFunctionBodies & 1U) == 0) || (this->startIndex == sVar5)) {
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_90);
      IRBuilder::visitFunctionStart((Result<wasm::Ok> *)&err,&this->builder,pFVar6);
      psVar8 = (string *)Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
      if (psVar8 != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),psVar8);
        throwError(this,(string *)
                        ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      while (this->pos < (ulong)(uint)func) {
        readInst((Result<wasm::Ok> *)&err_1,this);
        local_150 = (string *)Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
        if (local_150 != (string *)0x0) {
          std::__cxx11::string::string((string *)&local_170,local_150);
          throwError(this,&local_170);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
      }
      if (this->pos != (ulong)(uint)func) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"function overflowed its bounds",&local_191);
        throwError(this,&local_190);
      }
      bVar3 = IRBuilder::empty(&this->builder);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"expected function end",&local_1b9);
        throwError(this,&local_1b8);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    }
    else {
      Builder::Builder((Builder *)
                       ((long)&start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this->wasm);
      pEVar7 = (Expression *)
               Builder::makeUnreachable
                         ((Builder *)
                          ((long)&start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_90);
      pFVar6->body = pEVar7;
      this->pos = (ulong)(uint)func;
    }
    SourceMapReader::finishFunction(&this->sourceMapReader);
    pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_90);
    TypeUpdating::handleNonDefaultableLocals(pFVar6,this->wasm);
    this->currFunction = (Function *)0x0;
    sizePos = sizePos + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::readFunctions() {
  numFuncBodies = getU32LEB();
  if (numFuncBodies + numFuncImports != wasm.functions.size()) {
    throwError("invalid function section size, must equal types");
  }
  if (DWARF) {
    builder.setBinaryLocation(&pos, codeSectionLocation);
  }
  for (size_t i = 0; i < numFuncBodies; i++) {
    auto sizePos = pos;
    size_t size = getU32LEB();
    if (size == 0) {
      throwError("empty function size");
    }
    Index endOfFunction = pos + size;

    auto& func = wasm.functions[numFuncImports + i];
    currFunction = func.get();

    if (DWARF) {
      func->funcLocation = BinaryLocations::FunctionLocations{
        BinaryLocation(sizePos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation + size)};
    }

    func->prologLocation = sourceMapReader.readDebugLocationAt(pos);

    readVars();
    setLocalNames(*func, numFuncImports + i);
    {
      // Process the function body. Even if we are skipping function bodies we
      // need to not skip the start function. That contains important code for
      // wasm-emscripten-finalize in the form of pthread-related segment
      // initializations. As this is just one function, it doesn't add
      // significant time, so the optimization of skipping bodies is still very
      // useful.
      auto currFunctionIndex = wasm.functions.size();
      bool isStart = startIndex == currFunctionIndex;
      if (skipFunctionBodies && !isStart) {
        // When skipping the function body we need to put something valid in
        // their place so we validate. An unreachable is always acceptable
        // there.
        func->body = Builder(wasm).makeUnreachable();
        // Skip reading the contents.
        pos = endOfFunction;
      } else {
        auto start = builder.visitFunctionStart(func.get());
        if (auto* err = start.getErr()) {
          throwError(err->msg);
        }
        while (pos < endOfFunction) {
          auto inst = readInst();
          if (auto* err = inst.getErr()) {
            throwError(err->msg);
          }
        }
        if (pos != endOfFunction) {
          throwError("function overflowed its bounds");
        }
        if (!builder.empty()) {
          throwError("expected function end");
        }
      }
    }

    sourceMapReader.finishFunction();
    TypeUpdating::handleNonDefaultableLocals(func.get(), wasm);
    currFunction = nullptr;
  }
}